

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDU_Factory.cpp
# Opt level: O3

void __thiscall KDIS::UTILS::PDU_Factory::~PDU_Factory(PDU_Factory *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  
  this->_vptr_PDU_Factory = (_func_int **)&PTR_Decode_00220b80;
  ppPVar2 = (this->m_vFilters).
            super__Vector_base<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar1 = (this->m_vFilters).
            super__Vector_base<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar2 != ppPVar1) {
    do {
      if (*ppPVar2 != (PDU_Factory_Filter *)0x0) {
        (**(code **)(*(long *)*ppPVar2 + 8))();
      }
      ppPVar2 = ppPVar2 + 1;
    } while (ppPVar2 != ppPVar1);
    ppPVar2 = (this->m_vFilters).
              super__Vector_base<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppPVar2 != (pointer)0x0) {
    operator_delete(ppPVar2,(long)(this->m_vFilters).
                                  super__Vector_base<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar2
                   );
    return;
  }
  return;
}

Assistant:

PDU_Factory::~PDU_Factory()
{
    // Delete the filters
    vector<PDU_Factory_Filter*>::iterator itr = m_vFilters.begin();
    vector<PDU_Factory_Filter*>::iterator itrEnd = m_vFilters.end();
    for( ; itr != itrEnd; ++itr )
    {
        delete *itr;
    }
}